

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O0

char * get_stat_databuf(stat *sbuf)

{
  tm *__tp;
  tm *p_tm;
  time_t local_time;
  timeval tv;
  char *p_data_format;
  stat *sbuf_local;
  
  tv.tv_usec = (__suseconds_t)anon_var_dwarf_31e7;
  gettimeofday((timeval *)&local_time,(__timezone_ptr_t)0x0);
  p_tm = (tm *)local_time;
  if ((local_time < (sbuf->st_mtim).tv_sec) || (0xeff100 < local_time - (sbuf->st_mtim).tv_sec)) {
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_31f2;
  }
  __tp = localtime((time_t *)&p_tm);
  strftime(get_stat_databuf::databuf,0x40,(char *)tv.tv_usec,__tp);
  return get_stat_databuf::databuf;
}

Assistant:

const char *get_stat_databuf(struct stat *sbuf) {
  static char databuf[64] = {0};
  const char *p_data_format = "%b %e %H:%M";
  struct timeval tv;
  gettimeofday(&tv, NULL);
  time_t local_time = tv.tv_sec;
  if (sbuf->st_mtime > local_time || (local_time - sbuf->st_mtime) > HALF_YEAR_SEC) {
    p_data_format = "%b %e    %Y";
  }

  struct tm *p_tm = localtime(&local_time);
  strftime(databuf, sizeof(databuf), p_data_format, p_tm);

  return databuf;
}